

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uavs3d.c
# Opt level: O3

int uavs3d_output_frame(void *id,uavs3d_io_frm_t *frm,int flush,
                       uavs3d_lib_output_callback_t callback)

{
  uint in_EAX;
  com_pic_t *pcVar1;
  int ret;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if (frm != (uavs3d_io_frm_t *)0x0) {
    frm->got_pic = 0;
  }
  if (*(int *)((long)id + 0x17cc) < 1) {
    uStack_28 = 0xffffffff00000000;
  }
  else {
    pcVar1 = com_picman_out_pic((com_pic_manager_t *)((long)id + 0x1788),
                                (int *)((long)&uStack_28 + 4),*(u8 *)((long)id + 0x17c8),flush);
    if (pcVar1 != (com_pic_t *)0x0 && frm != (uavs3d_io_frm_t *)0x0) {
      frm->num_plane = 2;
      frm->bit_depth = pcVar1->bit_depth;
      frm->buffer[0] = pcVar1->y;
      frm->stride[0] = pcVar1->stride_luma;
      frm->width[0] = pcVar1->width_luma;
      frm->height[0] = pcVar1->height_luma;
      frm->buffer[1] = pcVar1->uv;
      frm->stride[1] = pcVar1->stride_chroma;
      frm->width[1] = pcVar1->width_chroma;
      frm->height[1] = pcVar1->height_chroma;
      frm->ptr = pcVar1->ptr;
      frm->pts = pcVar1->pts;
      frm->dtr = (long)pcVar1->dtr;
      frm->dts = pcVar1->dts;
      frm->type = pcVar1->type;
      frm->pkt_pos = pcVar1->pkt_pos;
      frm->pkt_size = pcVar1->pkt_size;
      frm->refpic_num[0] = pcVar1->refpic_num[0];
      frm->refpic_num[1] = pcVar1->refpic_num[1];
      memcpy(frm->refpic,pcVar1->refpic,0x100);
      frm->seqhdr = (com_seqh_t *)((long)id + 8);
      frm->got_pic = 1;
      *(int *)((long)id + 0x17cc) = *(int *)((long)id + 0x17cc) + -1;
      if (callback != (uavs3d_lib_output_callback_t)0x0) {
        (*callback)(frm);
      }
    }
  }
  return uStack_28._4_4_;
}

Assistant:

int uavs3d_output_frame(void *id, uavs3d_io_frm_t *frm, int flush, uavs3d_lib_output_callback_t callback) {
    int ret = 0;
    uavs3d_dec_t *ctx = id;

    if(frm) frm->got_pic = 0;

    if (ctx->output > 0) {
        com_pic_t *pic = com_picman_out_pic(&ctx->pic_manager, &ret, ctx->cur_decoded_doi, flush);

        if (pic && frm) {
            frm->num_plane = 2;
            frm->bit_depth = pic->bit_depth;

            frm->buffer[0] = pic->y;
            frm->stride[0] = pic->stride_luma * sizeof(pel);
            frm->width [0] = pic->width_luma;
            frm->height[0] = pic->height_luma;

            frm->buffer[1] = pic->uv;
            frm->stride[1] = pic->stride_chroma * sizeof(pel);
            frm->width [1] = pic->width_chroma;
            frm->height[1] = pic->height_chroma;

            frm->ptr  = pic->ptr;
            frm->pts  = pic->pts;
            frm->dtr  = pic->dtr;
            frm->dts  = pic->dts;
            frm->type = pic->type;

            frm->pkt_pos  = pic->pkt_pos;
            frm->pkt_size = pic->pkt_size;

            frm->refpic_num[0] = pic->refpic_num[0];
            frm->refpic_num[1] = pic->refpic_num[1];
            memcpy(frm->refpic, pic->refpic, 2 * 16 * sizeof(long long));

            frm->seqhdr = &ctx->seqhdr;
            frm->got_pic = 1;
            ctx->output--;

            if (callback) {
                callback(frm);
            }
        }
    } else {
        ret = -1;
    }

    return ret;
}